

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

PList * p_hash_table_lookup_by_value(PHashTable *table,pconstpointer val,PCompareFunc func)

{
  pint pVar1;
  PList *list;
  ulong uVar2;
  PHashTableNode *pPVar3;
  ulong uVar4;
  
  if (table != (PHashTable *)0x0) {
    uVar2 = table->size;
    uVar4 = 0;
    if (uVar2 != 0) {
      list = (PList *)0x0;
      do {
        pPVar3 = table->table[uVar4];
        if (pPVar3 != (PHashTableNode *)0x0) {
          do {
            if (func == (PCompareFunc)0x0) {
              if (pPVar3->value == val) goto LAB_001084de;
            }
            else {
              pVar1 = (*func)(pPVar3->value,val);
              if (pVar1 == 0) {
LAB_001084de:
                list = p_list_append(list,pPVar3->key);
              }
            }
            pPVar3 = pPVar3->next;
          } while (pPVar3 != (PHashTableNode *)0x0);
          uVar2 = table->size;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
        if (uVar2 <= uVar4) {
          return list;
        }
      } while( true );
    }
  }
  return (PList *)0x0;
}

Assistant:

P_LIB_API PList *
p_hash_table_lookup_by_value (const PHashTable *table, pconstpointer val, PCompareFunc func)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;
	pboolean	res;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next) {
			if (func == NULL)
				res = (node->value == val);
			else
				res = (func (node->value, val) == 0);

			if (res)
				ret = p_list_append (ret, node->key);
		}

	return ret;
}